

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::SocketWriter::SocketWriter
          (SocketWriter *this,string *host,string *port)

{
  pointer pcVar1;
  
  (this->super_AbstractSocketWriter)._vptr_AbstractSocketWriter =
       (_func_int **)&PTR__SocketWriter_004f7a40;
  this->sockfd_ = -1;
  (this->host_name_)._M_dataplus._M_p = (pointer)&(this->host_name_).field_2;
  pcVar1 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_name_,pcVar1,pcVar1 + host->_M_string_length);
  (this->port_num_)._M_dataplus._M_p = (pointer)&(this->port_num_).field_2;
  pcVar1 = (port->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->port_num_,pcVar1,pcVar1 + port->_M_string_length);
  MakeConnection(this);
  return;
}

Assistant:

SocketWriter(const std::string& host, const std::string& port)
        : sockfd_(-1), host_name_(host), port_num_(port) {
      MakeConnection();
    }